

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O2

void anon_unknown.dwarf_1f38a46::PrepBuffers<unsigned_short>
               (ACMRandom *rnd,int w,int h,int stride,int bd,bool trash_edges,unsigned_short *data)

{
  uint16_t uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  unsigned_short *puVar6;
  int c;
  ulong uVar7;
  ulong uVar8;
  
  FillEdge<unsigned_short>(rnd,stride << 5,bd,trash_edges,data);
  uVar4 = 0;
  uVar8 = 0;
  if (0 < w) {
    uVar8 = (ulong)(uint)w;
  }
  lVar3 = (long)stride;
  uVar2 = 0;
  if (0 < h) {
    uVar2 = (ulong)(uint)h;
  }
  puVar6 = data + lVar3 * 0x20 + 0x20;
  for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    FillEdge<unsigned_short>(rnd,0x20,bd,trash_edges,data + (uVar4 + 0x20) * lVar3);
    for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      uVar1 = libaom_test::ACMRandom::Rand16(rnd);
      puVar6[uVar7] = uVar1 & ~(ushort)(-1 << ((byte)bd & 0x1f));
    }
    FillEdge<unsigned_short>(rnd,0x20,bd,trash_edges,data + (uVar4 + 0x20) * lVar3 + (long)w + 0x20)
    ;
    puVar6 = puVar6 + lVar3;
  }
  FillEdge<unsigned_short>(rnd,stride << 5,bd,trash_edges,data + (h + 0x20) * stride);
  iVar5 = (h + 0x40) * stride;
  memcpy(data + iVar5,data,(long)(iVar5 * 2));
  return;
}

Assistant:

void PrepBuffers(ACMRandom *rnd, int w, int h, int stride, int bd,
                 bool trash_edges, Pixel *data) {
  assert(rnd);
  const Pixel mask = (1 << bd) - 1;

  // Fill in the first buffer with random data
  // Top border
  FillEdge(rnd, stride * kVPad, bd, trash_edges, data);
  for (int r = 0; r < h; ++r) {
    Pixel *row_data = data + (kVPad + r) * stride;
    // Left border, contents, right border
    FillEdge(rnd, kHPad, bd, trash_edges, row_data);
    for (int c = 0; c < w; ++c) row_data[kHPad + c] = rnd->Rand16() & mask;
    FillEdge(rnd, kHPad, bd, trash_edges, row_data + kHPad + w);
  }
  // Bottom border
  FillEdge(rnd, stride * kVPad, bd, trash_edges, data + stride * (kVPad + h));

  const int bpp = sizeof(*data);
  const int block_elts = stride * (h + 2 * kVPad);
  const int block_size = bpp * block_elts;

  // Now copy that to the second buffer
  memcpy(data + block_elts, data, block_size);
}